

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arraySlice.c
# Opt level: O3

void sysbvm_arraySlice_atPut(sysbvm_tuple_t arraySlice,size_t index,sysbvm_tuple_t value)

{
  ulong uVar1;
  long lVar2;
  
  if ((arraySlice & 0xf) == 0 && arraySlice != 0) {
    uVar1 = *(ulong *)(arraySlice + 0x18);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      lVar2 = (long)uVar1 >> 4;
    }
    else {
      lVar2 = *(long *)(uVar1 + 0x10);
    }
    uVar1 = *(ulong *)(arraySlice + 0x20);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      uVar1 = (long)uVar1 >> 4;
    }
    else {
      uVar1 = *(ulong *)(uVar1 + 0x10);
    }
    if (uVar1 <= index) {
      sysbvm_error_indexOutOfBounds();
    }
    sysbvm_arrayOrByteArray_atPut(*(sysbvm_tuple_t *)(arraySlice + 0x10),lVar2 + index,value);
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_arraySlice_atPut(sysbvm_tuple_t arraySlice, size_t index, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(arraySlice))
        return;

    sysbvm_arraySlice_t *arraySliceObject = (sysbvm_arraySlice_t*)arraySlice;
    size_t offset = sysbvm_tuple_size_decode(arraySliceObject->offset);
    size_t size = sysbvm_tuple_size_decode(arraySliceObject->size);
    if(index >= size)
        sysbvm_error_indexOutOfBounds();
 
    sysbvm_arrayOrByteArray_atPut(arraySliceObject->elements, offset + index, value);
}